

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotate_bspline.h
# Opt level: O0

void __thiscall
Rotate_BSpline_Segment::Rotate_BSpline_Segment(Rotate_BSpline_Segment *this,Material *m)

{
  Material *in_RSI;
  Object *in_RDI;
  BoundingBox *pBVar1;
  BoundingBox *this_00;
  
  Object::Object(in_RDI,in_RSI);
  in_RDI->_vptr_Object = (_func_int **)&PTR_intersect_003d0e98;
  Vector3f::Vector3f((Vector3f *)(in_RDI + 1),0.0);
  pBVar1 = (BoundingBox *)&in_RDI[1].m;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2a4e80);
  this_00 = (BoundingBox *)&in_RDI[2].m;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2a4e93);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2a4ea6);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2a4eb9);
  BoundingBox::BoundingBox(this_00,pBVar1);
  return;
}

Assistant:

Rotate_BSpline_Segment(Material* m) :Object(m) { }